

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O1

bool __thiscall cmCTestRunTest::StartTest(cmCTestRunTest *this,size_t total)

{
  uint uVar1;
  cmCTest *pcVar2;
  cmCTestTestProperties *pcVar3;
  char *pcVar4;
  pointer pcVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  ostream *poVar9;
  cmProcess *pcVar10;
  _Base_ptr p_Var11;
  string *psVar12;
  _Rb_tree_header *p_Var13;
  pointer pbVar14;
  double testTimeOut;
  string msg;
  ostringstream cmCTestLog_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string *local_1e8;
  long *local_1e0;
  long local_1d0 [2];
  cmCTestRunTest *local_1c0;
  cmCTestTestProperties *local_1b8;
  string *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  this->TotalNumberOfTests = total;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  lVar8 = 0xe;
  if (total < 100) {
    lVar8 = (ulong)(9 < total) * 2 + 10;
  }
  *(long *)(local_1a8 + *(long *)(local_1a8._0_8_ + -0x18) + 0x10) = lVar8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Start ",6);
  uVar1 = this->TestHandler->MaxIndex;
  lVar8 = 3;
  if (uVar1 < 100) {
    lVar8 = 2 - (ulong)(uVar1 < 10);
  }
  *(long *)(local_1a8 + *(long *)(local_1a8._0_8_ + -0x18) + 0x10) = lVar8;
  poVar9 = (ostream *)std::ostream::operator<<(local_1a8,this->TestProperties->Index);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(this->TestProperties->Name)._M_dataplus._M_p,
                      (this->TestProperties->Name)._M_string_length);
  std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  pcVar2 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,2,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x1aa,local_208._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,
                    CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                             local_208.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  (this->ProcessOutput)._M_string_length = 0;
  *(this->ProcessOutput)._M_dataplus._M_p = '\0';
  if (this->TestProperties->Disabled == true) {
    (this->TestResult).Properties = this->TestProperties;
    (this->TestResult).ExecutionTime = 0.0;
    (this->TestResult).CompressOutput = false;
    (this->TestResult).ReturnValue = -1;
    std::__cxx11::string::_M_replace
              ((ulong)&(this->TestResult).CompletionStatus,0,
               (char *)(this->TestResult).CompletionStatus._M_string_length,0x635fd3);
    (this->TestResult).Status = 0;
    (this->TestResult).TestCount = this->TestProperties->Index;
    std::__cxx11::string::_M_assign((string *)&this->TestResult);
    std::__cxx11::string::_M_assign((string *)&(this->TestResult).Path);
    pcVar10 = (cmProcess *)operator_new(0xc0);
    cmProcess::cmProcess(pcVar10);
    this->TestProcess = pcVar10;
    std::__cxx11::string::_M_replace
              ((ulong)&(this->TestResult).Output,0,
               (char *)(this->TestResult).Output._M_string_length,0x635fd3);
    std::__cxx11::string::_M_replace
              ((ulong)&(this->TestResult).FullCommandLine,0,
               (char *)(this->TestResult).FullCommandLine._M_string_length,0x674b0e);
    return false;
  }
  ComputeArguments(this);
  pcVar3 = this->TestProperties;
  pcVar4 = (char *)(this->TestResult).CompletionStatus._M_string_length;
  (this->TestResult).Properties = pcVar3;
  (this->TestResult).ExecutionTime = 0.0;
  (this->TestResult).CompressOutput = false;
  (this->TestResult).ReturnValue = -1;
  local_1e8 = &(this->TestResult).CompletionStatus;
  std::__cxx11::string::_M_replace((ulong)local_1e8,0,pcVar4,0x639b86);
  (this->TestResult).Status = 8;
  (this->TestResult).TestCount = this->TestProperties->Index;
  std::__cxx11::string::_M_assign((string *)&this->TestResult);
  std::__cxx11::string::_M_assign((string *)&(this->TestResult).Path);
  if ((this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    pbVar14 = (pcVar3->Args).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (((ulong)((long)(pcVar3->Args).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14) < 0x21) ||
       (iVar7 = std::__cxx11::string::compare((char *)(pbVar14 + 1)), iVar7 != 0)) {
      pbVar14 = (this->TestProperties->RequiredFiles).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_1b8 = pcVar3;
      if (pbVar14 !=
          (this->TestProperties->RequiredFiles).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_1c0 = (cmCTestRunTest *)&(this->TestResult).Output;
        local_1b0 = &(this->TestResult).FullCommandLine;
        do {
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
          pcVar5 = (pbVar14->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_208,pcVar5,pcVar5 + pbVar14->_M_string_length);
          bVar6 = cmsys::SystemTools::FileExists(local_208._M_dataplus._M_p);
          if (bVar6) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p,
                              CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                                       local_208.field_2._M_local_buf[0]) + 1);
            }
          }
          else {
            pcVar10 = (cmProcess *)operator_new(0xc0);
            cmProcess::cmProcess(pcVar10);
            this->TestProcess = pcVar10;
            poVar9 = this->TestHandler->LogFile;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"Unable to find required file: ",0x1e);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,local_208._M_dataplus._M_p,local_208._M_string_length);
            std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Unable to find required file: ",0x1e);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_208._M_dataplus._M_p,
                                local_208._M_string_length);
            std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            pcVar2 = this->CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,6,
                         "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                         ,0x1fb,(char *)local_1e0,false);
            if (local_1e0 != local_1d0) {
              operator_delete(local_1e0,local_1d0[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a8,"Unable to find required file: ",&local_208);
            std::__cxx11::string::operator=((string *)local_1c0,(string *)local_1a8);
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            std::__cxx11::string::_M_replace
                      ((ulong)local_1b0,0,
                       (char *)(this->TestResult).FullCommandLine._M_string_length,0x674b0e);
            std::__cxx11::string::_M_replace
                      ((ulong)local_1e8,0,
                       (char *)(this->TestResult).CompletionStatus._M_string_length,0x639c6a);
            (this->TestResult).Status = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p,
                              CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                                       local_208.field_2._M_local_buf[0]) + 1);
            }
            if (!bVar6) {
              return false;
            }
          }
          pbVar14 = pbVar14 + 1;
        } while (pbVar14 !=
                 (this->TestProperties->RequiredFiles).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      iVar7 = std::__cxx11::string::compare((char *)&this->ActualCommand);
      if (iVar7 == 0) {
        pcVar10 = (cmProcess *)operator_new(0xc0);
        cmProcess::cmProcess(pcVar10);
        this->TestProcess = pcVar10;
        poVar9 = this->TestHandler->LogFile;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"Unable to find executable: ",0x1b);
        pcVar3 = local_1b8;
        pbVar14 = (local_1b8->Args).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,pbVar14[1]._M_dataplus._M_p,pbVar14[1]._M_string_length);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Unable to find executable: ",0x1b);
        pbVar14 = (pcVar3->Args).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,pbVar14[1]._M_dataplus._M_p,
                            pbVar14[1]._M_string_length);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        pcVar2 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,6,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x20b,local_208._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,
                          CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                                   local_208.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,"Unable to find executable: ",
                       (pcVar3->Args).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
        std::__cxx11::string::operator=((string *)&(this->TestResult).Output,(string *)local_1a8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        std::__cxx11::string::_M_replace
                  ((ulong)&(this->TestResult).FullCommandLine,0,
                   (char *)(this->TestResult).FullCommandLine._M_string_length,0x674b0e);
        std::__cxx11::string::_M_replace
                  ((ulong)local_1e8,0,(char *)(this->TestResult).CompletionStatus._M_string_length,
                   0x639c9d);
        (this->TestResult).Status = 0;
        return false;
      }
      cmCTest::CurrentTime_abi_cxx11_((string *)local_1a8,this->CTest);
      std::__cxx11::string::operator=((string *)&this->StartTime,(string *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      testTimeOut = ResolveTimeout(this);
      if (this->StopTimePassed != false) {
        return false;
      }
      bVar6 = ForkProcess(this,testTimeOut,this->TestProperties->ExplicitTimeout,
                          &this->TestProperties->Environment);
      return bVar6;
    }
    pcVar10 = (cmProcess *)operator_new(0xc0);
    cmProcess::cmProcess(pcVar10);
    this->TestProcess = pcVar10;
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    local_208._M_string_length = 0;
    local_208.field_2._M_local_buf[0] = '\0';
    psVar12 = cmCTest::GetConfigType_abi_cxx11_(this->CTest);
    if (psVar12->_M_string_length == 0) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_208,0,(char *)local_208._M_string_length,0x639bca);
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)&local_208,0,(char *)local_208._M_string_length,0x639c0f);
      psVar12 = cmCTest::GetConfigType_abi_cxx11_(this->CTest);
      std::__cxx11::string::_M_append((char *)&local_208,(ulong)(psVar12->_M_dataplus)._M_p);
    }
    std::__cxx11::string::append((char *)&local_208);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (this->TestHandler->LogFile,local_208._M_dataplus._M_p,
                        local_208._M_string_length);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,6,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x1e7,(char *)local_1e0,false);
    if (local_1e0 != local_1d0) {
      operator_delete(local_1e0,local_1d0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::string::_M_assign((string *)&(this->TestResult).Output);
    std::__cxx11::string::_M_replace
              ((ulong)&(this->TestResult).FullCommandLine,0,
               (char *)(this->TestResult).FullCommandLine._M_string_length,0x674b0e);
    std::__cxx11::string::_M_replace
              ((ulong)local_1e8,0,(char *)(this->TestResult).CompletionStatus._M_string_length,
               0x639c35);
  }
  else {
    pcVar10 = (cmProcess *)operator_new(0xc0);
    cmProcess::cmProcess(pcVar10);
    this->TestProcess = pcVar10;
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,"Failed test dependencies:","");
    p_Var11 = (this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var13 = &(this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header;
    local_1c0 = this;
    if ((_Rb_tree_header *)p_Var11 != p_Var13) {
      do {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8," ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var11 + 1));
        std::__cxx11::string::_M_append((char *)&local_208,local_1a8._0_8_);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
      } while ((_Rb_tree_header *)p_Var11 != p_Var13);
    }
    this = local_1c0;
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1c0->TestHandler->LogFile,local_208._M_dataplus._M_p,
                        local_208._M_string_length);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x1d3,(char *)local_1e0,false);
    if (local_1e0 != local_1d0) {
      operator_delete(local_1e0,local_1d0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::string::_M_assign((string *)&(this->TestResult).Output);
    std::__cxx11::string::_M_replace
              ((ulong)&(this->TestResult).FullCommandLine,0,
               (char *)(this->TestResult).FullCommandLine._M_string_length,0x674b0e);
    std::__cxx11::string::_M_replace
              ((ulong)local_1e8,0,(char *)(this->TestResult).CompletionStatus._M_string_length,
               0x639bb0);
  }
  (this->TestResult).Status = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,
                    CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                             local_208.field_2._M_local_buf[0]) + 1);
  }
  return false;
}

Assistant:

bool cmCTestRunTest::StartTest(size_t total)
{
  this->TotalNumberOfTests = total; // save for rerun case
  cmCTestLog(this->CTest, HANDLER_OUTPUT, std::setw(2 * getNumWidth(total) + 8)
               << "Start "
               << std::setw(getNumWidth(this->TestHandler->GetMaxIndex()))
               << this->TestProperties->Index << ": "
               << this->TestProperties->Name << std::endl);
  this->ProcessOutput.clear();

  // Return immediately if test is disabled
  if (this->TestProperties->Disabled) {
    this->TestResult.Properties = this->TestProperties;
    this->TestResult.ExecutionTime = 0;
    this->TestResult.CompressOutput = false;
    this->TestResult.ReturnValue = -1;
    this->TestResult.CompletionStatus = "Disabled";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    this->TestResult.TestCount = this->TestProperties->Index;
    this->TestResult.Name = this->TestProperties->Name;
    this->TestResult.Path = this->TestProperties->Directory;
    this->TestProcess = new cmProcess;
    this->TestResult.Output = "Disabled";
    this->TestResult.FullCommandLine = "";
    return false;
  }

  this->ComputeArguments();
  std::vector<std::string>& args = this->TestProperties->Args;
  this->TestResult.Properties = this->TestProperties;
  this->TestResult.ExecutionTime = 0;
  this->TestResult.CompressOutput = false;
  this->TestResult.ReturnValue = -1;
  this->TestResult.CompletionStatus = "Failed to start";
  this->TestResult.Status = cmCTestTestHandler::BAD_COMMAND;
  this->TestResult.TestCount = this->TestProperties->Index;
  this->TestResult.Name = this->TestProperties->Name;
  this->TestResult.Path = this->TestProperties->Directory;

  if (!this->FailedDependencies.empty()) {
    this->TestProcess = new cmProcess;
    std::string msg = "Failed test dependencies:";
    for (std::set<std::string>::const_iterator it =
           this->FailedDependencies.begin();
         it != this->FailedDependencies.end(); ++it) {
      msg += " " + *it;
    }
    *this->TestHandler->LogFile << msg << std::endl;
    cmCTestLog(this->CTest, HANDLER_OUTPUT, msg << std::endl);
    this->TestResult.Output = msg;
    this->TestResult.FullCommandLine = "";
    this->TestResult.CompletionStatus = "Fixture dependency failed";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }

  if (args.size() >= 2 && args[1] == "NOT_AVAILABLE") {
    this->TestProcess = new cmProcess;
    std::string msg;
    if (this->CTest->GetConfigType().empty()) {
      msg = "Test not available without configuration.";
      msg += "  (Missing \"-C <config>\"?)";
    } else {
      msg = "Test not available in configuration \"";
      msg += this->CTest->GetConfigType();
      msg += "\".";
    }
    *this->TestHandler->LogFile << msg << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE, msg << std::endl);
    this->TestResult.Output = msg;
    this->TestResult.FullCommandLine = "";
    this->TestResult.CompletionStatus = "Missing Configuration";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }

  // Check if all required files exist
  for (std::vector<std::string>::iterator i =
         this->TestProperties->RequiredFiles.begin();
       i != this->TestProperties->RequiredFiles.end(); ++i) {
    std::string file = *i;

    if (!cmSystemTools::FileExists(file.c_str())) {
      // Required file was not found
      this->TestProcess = new cmProcess;
      *this->TestHandler->LogFile << "Unable to find required file: " << file
                                  << std::endl;
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Unable to find required file: " << file << std::endl);
      this->TestResult.Output = "Unable to find required file: " + file;
      this->TestResult.FullCommandLine = "";
      this->TestResult.CompletionStatus = "Required Files Missing";
      this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
      return false;
    }
  }
  // log and return if we did not find the executable
  if (this->ActualCommand == "") {
    // if the command was not found create a TestResult object
    // that has that information
    this->TestProcess = new cmProcess;
    *this->TestHandler->LogFile << "Unable to find executable: " << args[1]
                                << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Unable to find executable: " << args[1] << std::endl);
    this->TestResult.Output = "Unable to find executable: " + args[1];
    this->TestResult.FullCommandLine = "";
    this->TestResult.CompletionStatus = "Unable to find executable";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }
  this->StartTime = this->CTest->CurrentTime();

  double timeout = this->ResolveTimeout();

  if (this->StopTimePassed) {
    return false;
  }
  return this->ForkProcess(timeout, this->TestProperties->ExplicitTimeout,
                           &this->TestProperties->Environment);
}